

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int encode_client_hello(ptls_context_t *ctx,ptls_buffer_t *sendbuf,encode_ch_mode mode,
                       int is_second_flight,ptls_handshake_properties_t *properties,
                       void *client_random,ptls_key_exchange_context_t *key_share_ctx,char *sni_name
                       ,ptls_iovec_t legacy_session_id,st_ptls_ech_t *ech,size_t *ech_size_offset,
                       ptls_iovec_t ech_replay,ptls_iovec_t psk_secret,ptls_iovec_t psk_identity,
                       uint32_t obfuscated_ticket_age,size_t psk_binder_size,ptls_iovec_t *cookie,
                       int using_early_data)

{
  size_t sVar1;
  uint8_t *src;
  ptls_iovec_t *ppVar2;
  ushort uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t len;
  size_t sVar8;
  long lVar9;
  ushort *puVar10;
  ptls_key_exchange_algorithm_t **pppVar11;
  ptls_cipher_suite_t **pppVar12;
  size_t local_b8;
  uint32_t age;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  ushort local_93;
  ushort local_91;
  uint8_t local_8f;
  uint8_t local_8e [3];
  ushort local_8b;
  undefined1 local_89;
  size_t local_88;
  size_t local_80;
  uint32_t local_74;
  size_t local_70;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  uint8_t local_5c;
  uint8_t local_5b;
  undefined2 local_5a;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  ushort local_3c;
  ushort local_3a [3];
  uint local_34;
  
  local_88 = CONCAT44(local_88._4_4_,is_second_flight);
  if (ech == (st_ptls_ech_t *)0x0 && mode != ENCODE_CH_MODE_INNER) {
    __assert_fail("mode == ENCODE_CH_MODE_INNER || ech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x86d,
                  "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                 );
  }
  local_89 = 1;
  iVar4 = ptls_buffer__do_pushv(sendbuf,&local_89,1);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",3);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar1 = sendbuf->off;
  local_3a[2] = 0x303;
  iVar4 = ptls_buffer__do_pushv(sendbuf,local_3a + 2,2);
  if (iVar4 != 0) {
    return iVar4;
  }
  local_70 = sVar1;
  iVar4 = ptls_buffer__do_pushv(sendbuf,client_random,0x20);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar1 = sendbuf->off;
  sVar5 = sVar1;
  if (mode != ENCODE_CH_MODE_ENCODED_INNER) {
    iVar4 = ptls_buffer__do_pushv(sendbuf,legacy_session_id.base,legacy_session_id.len);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar5 = sendbuf->off;
  }
  if (0xff < sVar5 - sVar1) {
    return 0x20c;
  }
  sendbuf->base[sVar1 - 1] = (uint8_t)(sVar5 - sVar1);
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar4 != 0) {
    return iVar4;
  }
  local_74 = obfuscated_ticket_age;
  sVar1 = sendbuf->off;
  pppVar12 = ctx->cipher_suites;
  while (*pppVar12 != (ptls_cipher_suite_t *)0x0) {
    uVar3 = (*pppVar12)->id;
    local_8b = uVar3 << 8 | uVar3 >> 8;
    iVar4 = ptls_buffer__do_pushv(sendbuf,&local_8b,2);
    pppVar12 = pppVar12 + 1;
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  uVar6 = sendbuf->off - sVar1;
  if (0xffff < uVar6) {
    return 0x20c;
  }
  sendbuf->base[sVar1 - 2] = (uint8_t)(uVar6 >> 8);
  sendbuf->base[sVar1 - 1] = (uint8_t)uVar6;
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar1 = sendbuf->off;
  local_8e[2] = 0;
  iVar4 = ptls_buffer__do_pushv(sendbuf,local_8e + 2,1);
  if (iVar4 != 0) {
    return iVar4;
  }
  uVar6 = sendbuf->off - sVar1;
  if (0xff < uVar6) {
    return 0x20c;
  }
  sendbuf->base[sVar1 - 1] = (uint8_t)uVar6;
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar1 = sendbuf->off;
  if (mode == ENCODE_CH_MODE_OUTER) {
    local_3a[1] = 0xdfe;
    iVar4 = ptls_buffer__do_pushv(sendbuf,local_3a + 1,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar5 = sendbuf->off;
    local_8e[1] = 0;
    iVar4 = ptls_buffer__do_pushv(sendbuf,local_8e + 1,1);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar3 = (ech->cipher->id).kdf;
    local_3a[0] = uVar3 << 8 | uVar3 >> 8;
    iVar4 = ptls_buffer__do_pushv(sendbuf,local_3a,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar3 = (ech->cipher->id).aead;
    local_3c = uVar3 << 8 | uVar3 >> 8;
    iVar4 = ptls_buffer__do_pushv(sendbuf,&local_3c,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_8e[0] = ech->config_id;
    iVar4 = ptls_buffer__do_pushv(sendbuf,local_8e,1);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar8 = sendbuf->off;
    sVar7 = sVar8;
    if ((int)local_88 == 0) {
      iVar4 = ptls_buffer__do_pushv(sendbuf,(ech->client).enc.base,(ech->client).enc.len);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar7 = sendbuf->off;
    }
    uVar6 = sVar7 - sVar8;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar8 = sendbuf->off;
    if ((int)local_88 == 0) {
      lVar9 = (ech->client).enc.len + 10;
    }
    else {
      lVar9 = 10;
    }
    if (sVar8 - sVar5 != lVar9) {
      __assert_fail("sendbuf->off - ext_payload_from == outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len)"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                    ,0x890,
                    "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                   );
    }
    iVar4 = ptls_buffer_reserve(sendbuf,*ech_size_offset);
    if (iVar4 != 0) {
      return iVar4;
    }
    memset(sendbuf->base + sendbuf->off,0,*ech_size_offset);
    sVar7 = sendbuf->off + *ech_size_offset;
    sendbuf->off = sVar7;
    *ech_size_offset = sVar7 - *ech_size_offset;
    uVar6 = sendbuf->off - sVar8;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
    uVar6 = sendbuf->off - sVar5;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
  }
  else {
    if (ech->aead == (ptls_aead_context_t *)0x0) {
      if (ech_replay.base != (uint8_t *)0x0) {
        local_40 = 0xdfe;
        iVar4 = ptls_buffer__do_pushv(sendbuf,&local_40,2);
        if (iVar4 != 0) {
          return iVar4;
        }
        iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
        if (iVar4 != 0) {
          return iVar4;
        }
        sVar5 = sendbuf->off;
        goto LAB_00116c7b;
      }
    }
    else {
      local_3e = 0xdfe;
      iVar4 = ptls_buffer__do_pushv(sendbuf,&local_3e,2);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar5 = sendbuf->off;
      ech_replay.base = &local_8f;
      local_8f = '\x01';
      ech_replay.len = 1;
LAB_00116c7b:
      iVar4 = ptls_buffer__do_pushv(sendbuf,ech_replay.base,ech_replay.len);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar6 = sendbuf->off - sVar5;
      if (0xffff < uVar6) {
        return 0x20c;
      }
      sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
      sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
    }
    if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
      local_42 = 0xfd;
      iVar4 = ptls_buffer__do_pushv(sendbuf,&local_42,2);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar5 = sendbuf->off;
      iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar8 = sendbuf->off;
      local_44 = 0x3300;
      iVar4 = ptls_buffer__do_pushv(sendbuf,&local_44,2);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar6 = sendbuf->off - sVar8;
      if (0xff < uVar6) {
        return 0x20c;
      }
      goto LAB_00116f55;
    }
  }
  local_46 = 0x3300;
  iVar4 = ptls_buffer__do_pushv(sendbuf,&local_46,2);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar5 = sendbuf->off;
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar8 = sendbuf->off;
  sVar7 = sVar8;
  if (key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    src = (key_share_ctx->pubkey).base;
    uVar3 = key_share_ctx->algo->id;
    sVar7 = (key_share_ctx->pubkey).len;
    age = CONCAT22(age._2_2_,uVar3 << 8 | uVar3 >> 8);
    iVar4 = ptls_buffer__do_pushv(sendbuf,&age,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_80 = sendbuf->off;
    iVar4 = ptls_buffer__do_pushv(sendbuf,src,sVar7);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar6 = sendbuf->off - local_80;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[local_80 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[local_80 - 1] = (uint8_t)uVar6;
    sVar7 = sendbuf->off;
  }
  uVar6 = sVar7 - sVar8;
  if (0xffff < uVar6) {
    return 0x20c;
  }
  sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
LAB_00116f55:
  sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
  uVar6 = sendbuf->off - sVar5;
  if (0xffff < uVar6) {
    return 0x20c;
  }
  sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
  sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
  if (sni_name != (char *)0x0) {
    local_48 = 0;
    iVar4 = ptls_buffer__do_pushv(sendbuf,&local_48,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar5 = sendbuf->off;
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar8 = sendbuf->off;
    age = age & 0xffffff00;
    iVar4 = ptls_buffer__do_pushv(sendbuf,&age,1);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar7 = sendbuf->off;
    len = strlen(sni_name);
    iVar4 = ptls_buffer__do_pushv(sendbuf,sni_name,len);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar6 = sendbuf->off - sVar7;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar7 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar7 - 1] = (uint8_t)uVar6;
    uVar6 = sendbuf->off - sVar8;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
    uVar6 = sendbuf->off - sVar5;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
  }
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     ((properties->field_0).client.negotiated_protocols.count != 0)) {
    local_4a = 0x1000;
    iVar4 = ptls_buffer__do_pushv(sendbuf,&local_4a,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar5 = sendbuf->off;
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_80 = sendbuf->off;
    lVar9 = 8;
    for (local_b8 = 0; local_b8 != (properties->field_0).client.negotiated_protocols.count;
        local_b8 = local_b8 + 1) {
      iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar8 = sendbuf->off;
      ppVar2 = (properties->field_0).client.negotiated_protocols.list;
      iVar4 = ptls_buffer__do_pushv
                        (sendbuf,*(void **)((long)ppVar2 + lVar9 + -8),
                         *(size_t *)((long)&ppVar2->base + lVar9));
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar6 = sendbuf->off - sVar8;
      if (0xff < uVar6) {
        return 0x20c;
      }
      sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
      lVar9 = lVar9 + 0x10;
    }
    uVar6 = sendbuf->off - local_80;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[local_80 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[local_80 - 1] = (uint8_t)uVar6;
    uVar6 = sendbuf->off - sVar5;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
  }
  if (ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    local_4c = 0x1b00;
    iVar4 = ptls_buffer__do_pushv(sendbuf,&local_4c,2);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar4 != 0) {
      return iVar4;
    }
    sVar5 = sendbuf->off;
    iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
    if (iVar4 != 0) {
      return iVar4;
    }
    puVar10 = ctx->decompress_certificate->supported_algorithms;
    uVar3 = *puVar10;
    if (uVar3 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x8c3,
                    "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                   );
    }
    sVar8 = sendbuf->off;
    while (puVar10 = puVar10 + 1, uVar3 != 0xffff) {
      local_91 = uVar3 << 8 | uVar3 >> 8;
      iVar4 = ptls_buffer__do_pushv(sendbuf,&local_91,2);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar3 = *puVar10;
    }
    uVar6 = sendbuf->off - sVar8;
    if (0xff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
    uVar6 = sendbuf->off - sVar5;
    if (0xffff < uVar6) {
      return 0x20c;
    }
    sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
    sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
  }
  local_4e = 0x2b00;
  iVar4 = ptls_buffer__do_pushv(sendbuf,&local_4e,2);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar5 = sendbuf->off;
  iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar8 = sendbuf->off;
  local_50 = 0x403;
  iVar4 = ptls_buffer__do_pushv(sendbuf,&local_50,2);
  if (iVar4 == 0) {
    uVar6 = sendbuf->off - sVar8;
    if (uVar6 < 0x100) {
      sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
      uVar6 = sendbuf->off - sVar5;
      if (uVar6 < 0x10000) {
        sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
        sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
        local_52 = 0xd00;
        iVar4 = ptls_buffer__do_pushv(sendbuf,&local_52,2);
        if (iVar4 != 0) {
          return iVar4;
        }
        iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
        if (iVar4 != 0) {
          return iVar4;
        }
        sVar5 = sendbuf->off;
        iVar4 = push_signature_algorithms(ctx->verify_certificate,sendbuf);
        if (iVar4 != 0) {
          return iVar4;
        }
        uVar6 = sendbuf->off - sVar5;
        if (uVar6 < 0x10000) {
          sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
          sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
          if (ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0) {
            local_54 = 0xa00;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_54,2);
            if (iVar4 != 0) {
              return iVar4;
            }
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar5 = sendbuf->off;
            pppVar11 = ctx->key_exchanges;
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar8 = sendbuf->off;
            while (*pppVar11 != (ptls_key_exchange_algorithm_t *)0x0) {
              uVar3 = (*pppVar11)->id;
              local_93 = uVar3 << 8 | uVar3 >> 8;
              iVar4 = ptls_buffer__do_pushv(sendbuf,&local_93,2);
              pppVar11 = pppVar11 + 1;
              if (iVar4 != 0) {
                return iVar4;
              }
            }
            uVar6 = sendbuf->off - sVar8;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
            uVar6 = sendbuf->off - sVar5;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
          }
          if ((cookie != (ptls_iovec_t *)0x0) && (cookie->base != (uint8_t *)0x0)) {
            local_56 = 0x2c00;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_56,2);
            if (iVar4 != 0) {
              return iVar4;
            }
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar5 = sendbuf->off;
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar8 = sendbuf->off;
            iVar4 = ptls_buffer__do_pushv(sendbuf,cookie->base,cookie->len);
            if (iVar4 != 0) {
              return iVar4;
            }
            uVar6 = sendbuf->off - sVar8;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
            uVar6 = sendbuf->off - sVar5;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
          }
          if ((ctx->field_0xb8 & 0x20) != 0) {
            local_58 = 0x1400;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_58,2);
            if (iVar4 != 0) {
              return iVar4;
            }
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar5 = sendbuf->off;
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar8 = sendbuf->off;
            local_94 = 2;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_94,1);
            if (iVar4 != 0) {
              return iVar4;
            }
            uVar6 = sendbuf->off - sVar8;
            if (0xff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
            uVar6 = sendbuf->off - sVar5;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
          }
          if ((ctx->save_ticket != (ptls_save_ticket_t *)0x0) &&
             (((ctx->ticket_requests).client.new_session_count != '\0' ||
              ((ctx->ticket_requests).client.resumption_count != '\0')))) {
            local_5a = 0x3a00;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_5a,2);
            if (iVar4 != 0) {
              return iVar4;
            }
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar5 = sendbuf->off;
            local_5c = (ctx->ticket_requests).client.new_session_count;
            local_5b = (ctx->ticket_requests).client.resumption_count;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_5c,2);
            if (iVar4 != 0) {
              return iVar4;
            }
            uVar6 = sendbuf->off - sVar5;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
          }
          iVar4 = push_additional_extensions(properties,sendbuf);
          if (iVar4 != 0) {
            return iVar4;
          }
          if (ctx->save_ticket != (ptls_save_ticket_t *)0x0 || psk_secret.base != (uint8_t *)0x0) {
            local_5e = 0x2d00;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_5e,2);
            if (iVar4 != 0) {
              return iVar4;
            }
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar5 = sendbuf->off;
            iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar8 = sendbuf->off;
            if ((ctx->field_0xb8 & 1) == 0) {
              local_95 = 0;
              iVar4 = ptls_buffer__do_pushv(sendbuf,&local_95,1);
              if (iVar4 != 0) {
                return iVar4;
              }
            }
            local_96 = 1;
            iVar4 = ptls_buffer__do_pushv(sendbuf,&local_96,1);
            if (iVar4 != 0) {
              return iVar4;
            }
            uVar6 = sendbuf->off - sVar8;
            if (0xff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
            uVar6 = sendbuf->off - sVar5;
            if (0xffff < uVar6) {
              return 0x20c;
            }
            sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
            if (psk_secret.base != (uint8_t *)0x0) {
              if ((int)local_88 == 0 && using_early_data != 0) {
                local_60 = 0x2a00;
                iVar4 = ptls_buffer__do_pushv(sendbuf,&local_60,2);
                if (iVar4 != 0) {
                  return iVar4;
                }
                iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
                if (iVar4 != 0) {
                  return iVar4;
                }
                sVar5 = sendbuf->off;
                for (lVar9 = -2; lVar9 != 0; lVar9 = lVar9 + 1) {
                  sendbuf->base[lVar9 + sVar5] = '\0';
                }
              }
              local_62 = 0x2900;
              iVar4 = ptls_buffer__do_pushv(sendbuf,&local_62,2);
              if (iVar4 != 0) {
                return iVar4;
              }
              iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
              if (iVar4 != 0) {
                return iVar4;
              }
              local_88 = sendbuf->off;
              iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
              if (iVar4 != 0) {
                return iVar4;
              }
              sVar5 = sendbuf->off;
              iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
              if (iVar4 != 0) {
                return iVar4;
              }
              sVar8 = sendbuf->off;
              if (mode == ENCODE_CH_MODE_OUTER) {
                iVar4 = ptls_buffer_reserve(sendbuf,psk_identity.len);
                if (iVar4 != 0) {
                  return iVar4;
                }
                (*ctx->random_bytes)(sendbuf->base + sendbuf->off,psk_identity.len);
                sVar7 = psk_identity.len + sendbuf->off;
                sendbuf->off = sVar7;
              }
              else {
                iVar4 = ptls_buffer__do_pushv(sendbuf,psk_identity.base,psk_identity.len);
                if (iVar4 != 0) {
                  return iVar4;
                }
                sVar7 = sendbuf->off;
              }
              uVar6 = sVar7 - sVar8;
              if (0xffff < uVar6) {
                return 0x20c;
              }
              sendbuf->base[sVar8 - 2] = (uint8_t)(uVar6 >> 8);
              sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
              if (mode == ENCODE_CH_MODE_OUTER) {
                (*ctx->random_bytes)(&age,4);
                local_74 = age;
              }
              else {
                age = obfuscated_ticket_age;
              }
              local_34 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                         local_74 << 0x18;
              iVar4 = ptls_buffer__do_pushv(sendbuf,&local_34,4);
              if (iVar4 != 0) {
                return iVar4;
              }
              uVar6 = sendbuf->off - sVar5;
              if (0xffff < uVar6) {
                return 0x20c;
              }
              sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
              sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
              iVar4 = ptls_buffer__do_pushv(sendbuf,"",2);
              if (iVar4 != 0) {
                return iVar4;
              }
              sVar5 = sendbuf->off;
              iVar4 = ptls_buffer__do_pushv(sendbuf,"",1);
              if (iVar4 != 0) {
                return iVar4;
              }
              sVar8 = sendbuf->off;
              iVar4 = ptls_buffer_reserve(sendbuf,psk_binder_size);
              if (iVar4 != 0) {
                return iVar4;
              }
              (*ctx->random_bytes)(sendbuf->base + sendbuf->off,psk_binder_size);
              sVar7 = psk_binder_size + sendbuf->off;
              sendbuf->off = sVar7;
              uVar6 = sVar7 - sVar8;
              if (0xff < uVar6) {
                return 0x20c;
              }
              sendbuf->base[sVar8 - 1] = (uint8_t)uVar6;
              uVar6 = sendbuf->off - sVar5;
              if (0xffff < uVar6) {
                return 0x20c;
              }
              sendbuf->base[sVar5 - 2] = (uint8_t)(uVar6 >> 8);
              sendbuf->base[sVar5 - 1] = (uint8_t)uVar6;
              uVar6 = sendbuf->off - local_88;
              if (0xffff < uVar6) {
                return 0x20c;
              }
              sendbuf->base[local_88 - 2] = (uint8_t)(uVar6 >> 8);
              sendbuf->base[local_88 - 1] = (uint8_t)uVar6;
            }
          }
          uVar6 = sendbuf->off - sVar1;
          if (uVar6 < 0x10000) {
            sendbuf->base[sVar1 - 2] = (uint8_t)(uVar6 >> 8);
            sendbuf->base[sVar1 - 1] = (uint8_t)uVar6;
            uVar6 = sendbuf->off - local_70;
            if (uVar6 < 0x1000000) {
              for (lVar9 = 0x10; lVar9 != -8; lVar9 = lVar9 + -8) {
                sendbuf->base[local_70 - 3] = (uint8_t)(uVar6 >> ((byte)lVar9 & 0x3f));
                local_70 = local_70 + 1;
              }
              return 0;
            }
            return 0x20c;
          }
        }
      }
    }
    return 0x20c;
  }
  return iVar4;
}

Assistant:

static int encode_client_hello(ptls_context_t *ctx, ptls_buffer_t *sendbuf, enum encode_ch_mode mode, int is_second_flight,
                               ptls_handshake_properties_t *properties, const void *client_random,
                               ptls_key_exchange_context_t *key_share_ctx, const char *sni_name, ptls_iovec_t legacy_session_id,
                               struct st_ptls_ech_t *ech, size_t *ech_size_offset, ptls_iovec_t ech_replay, ptls_iovec_t psk_secret,
                               ptls_iovec_t psk_identity, uint32_t obfuscated_ticket_age, size_t psk_binder_size,
                               ptls_iovec_t *cookie, int using_early_data)
{
    int ret;

    assert(mode == ENCODE_CH_MODE_INNER || ech != NULL);

    ptls_buffer_push_message_body(sendbuf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, client_random, PTLS_HELLO_RANDOM_SIZE);
        /* lecagy_session_id */
        ptls_buffer_push_block(sendbuf, 1, {
            if (mode != ENCODE_CH_MODE_ENCODED_INNER)
                ptls_buffer_pushv(sendbuf, legacy_session_id.base, legacy_session_id.len);
        });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            if (mode == ENCODE_CH_MODE_OUTER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO, {
                    size_t ext_payload_from = sendbuf->off;
                    ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_OUTER);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.kdf);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.aead);
                    ptls_buffer_push(sendbuf, ech->config_id);
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (!is_second_flight)
                            ptls_buffer_pushv(sendbuf, ech->client.enc.base, ech->client.enc.len);
                    });
                    ptls_buffer_push_block(sendbuf, 2, {
                        assert(sendbuf->off - ext_payload_from ==
                               outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len));
                        if ((ret = ptls_buffer_reserve(sendbuf, *ech_size_offset)) != 0)
                            goto Exit;
                        memset(sendbuf->base + sendbuf->off, 0, *ech_size_offset);
                        sendbuf->off += *ech_size_offset;
                        *ech_size_offset = sendbuf->off - *ech_size_offset;
                    });
                });
            } else if (ech->aead != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_INNER); });
            } else if (ech_replay.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_pushv(sendbuf, ech_replay.base, ech_replay.len); });
            }
            if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push16(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE); });
                });
            } else {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (key_share_ctx != NULL &&
                            (ret = push_key_share_entry(sendbuf, key_share_ctx->algo->id, key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    });
                });
            }
            if (sni_name != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                    if ((ret = emit_server_name_extension(sendbuf, sni_name)) != 0)
                        goto Exit;
                });
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            if (ctx->key_exchanges != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                    ptls_key_exchange_algorithm_t **algo = ctx->key_exchanges;
                    ptls_buffer_push_block(sendbuf, 2, {
                        for (; *algo != NULL; ++algo)
                            ptls_buffer_push16(sendbuf, (*algo)->id);
                    });
                });
            }
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if (ctx->save_ticket != NULL &&
                (ctx->ticket_requests.client.new_session_count != 0 || ctx->ticket_requests.client.resumption_count != 0)) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_TICKET_REQUEST, {
                    ptls_buffer_push(sendbuf, ctx->ticket_requests.client.new_session_count,
                                     ctx->ticket_requests.client.resumption_count);
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (ctx->save_ticket != NULL || psk_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (psk_secret.base != NULL) {
                if (using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2, {
                            if (mode == ENCODE_CH_MODE_OUTER) {
                                if ((ret = ptls_buffer_reserve(sendbuf, psk_identity.len)) != 0)
                                    goto Exit;
                                ctx->random_bytes(sendbuf->base + sendbuf->off, psk_identity.len);
                                sendbuf->off += psk_identity.len;
                            } else {
                                ptls_buffer_pushv(sendbuf, psk_identity.base, psk_identity.len);
                            }
                        });
                        uint32_t age;
                        if (mode == ENCODE_CH_MODE_OUTER) {
                            ctx->random_bytes(&age, sizeof(age));
                        } else {
                            age = obfuscated_ticket_age;
                        }
                        ptls_buffer_push32(sendbuf, age);
                    });
                    /* allocate space for PSK binder. The space is filled initially filled by a random value (meeting the
                     * requirement of ClientHelloOuter), and later gets filled with the correct binder value if necessary. */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, psk_binder_size)) != 0)
                                goto Exit;
                            ctx->random_bytes(sendbuf->base + sendbuf->off, psk_binder_size);
                            sendbuf->off += psk_binder_size;
                        });
                    });
                });
            }
        });
    });

Exit:
    return ret;
}